

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::
MatchAllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
describe(string *__return_storage_ptr__,
        MatchAllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference ppMVar3;
  string local_58;
  ulong local_38;
  size_t i;
  undefined1 local_19;
  MatchAllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  MatchAllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  string *description;
  
  local_19 = 0;
  local_18 = this;
  this_local = (MatchAllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::
  vector<const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ::size(&this->m_matchers);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"( ");
  for (local_38 = 0; uVar1 = local_38,
      sVar2 = std::
              vector<const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ::size(&this->m_matchers), uVar1 < sVar2; local_38 = local_38 + 1) {
    if (local_38 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," and ");
    }
    ppMVar3 = std::
              vector<const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ::operator[](&this->m_matchers,local_38);
    MatcherUntypedBase::toString_abi_cxx11_(&local_58,&(*ppMVar3)->super_MatcherUntypedBase);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," )");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string describe() const CATCH_OVERRIDE {
                std::string description;
                description.reserve( 4 + m_matchers.size()*32 );
                description += "( ";
                for( std::size_t i = 0; i < m_matchers.size(); ++i ) {
                    if( i != 0 )
                        description += " and ";
                    description += m_matchers[i]->toString();
                }
                description += " )";
                return description;
            }